

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

bool __thiscall inja::Parser::parse_expression_comparison(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  Op op;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  bVar1 = parse_expression_datum(this,tmpl);
  if (bVar1) {
    bVar1 = true;
    switch((this->m_tok).kind) {
    case Id:
      __x._M_len = (this->m_tok).text._M_len;
      __x._M_str = (this->m_tok).text._M_str;
      __y._M_str = "in";
      __y._M_len = 2;
      bVar1 = std::operator==(__x,__y);
      op = In;
      if (!bVar1) {
        return true;
      }
      break;
    default:
      goto switchD_0011522c_caseD_a;
    case Equal:
      op = Equal;
      break;
    case GreaterThan:
      op = Greater;
      break;
    case GreaterEqual:
      op = GreaterEqual;
      break;
    case LessThan:
      op = Less;
      break;
    case LessEqual:
      op = LessEqual;
      break;
    case NotEqual:
      op = Different;
    }
    get_next_token(this);
    bVar1 = parse_expression_datum(this,tmpl);
    if (bVar1) {
      append_function(this,tmpl,op,2);
      return true;
    }
  }
  bVar1 = false;
switchD_0011522c_caseD_a:
  return bVar1;
}

Assistant:

bool parse_expression_comparison(Template& tmpl) {
    if (!parse_expression_datum(tmpl)) return false;
    Bytecode::Op op;
    switch (m_tok.kind) {
      case Token::Kind::Id:
        if (m_tok.text == static_cast<decltype(m_tok.text)>("in"))
          op = Bytecode::Op::In;
        else
          return true;
        break;
      case Token::Kind::Equal:
        op = Bytecode::Op::Equal;
        break;
      case Token::Kind::GreaterThan:
        op = Bytecode::Op::Greater;
        break;
      case Token::Kind::LessThan:
        op = Bytecode::Op::Less;
        break;
      case Token::Kind::LessEqual:
        op = Bytecode::Op::LessEqual;
        break;
      case Token::Kind::GreaterEqual:
        op = Bytecode::Op::GreaterEqual;
        break;
      case Token::Kind::NotEqual:
        op = Bytecode::Op::Different;
        break;
      default:
        return true;
    }
    get_next_token();
    if (!parse_expression_datum(tmpl)) return false;
    append_function(tmpl, op, 2);
    return true;
  }